

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_fma::create_pipeline_int8_x86(Convolution_x86_fma *this,Option *opt)

{
  _func_int *p_Var1;
  float fVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  uint uVar15;
  uint uVar16;
  _func_int *p_Var17;
  size_t sVar18;
  Allocator *pAVar19;
  _func_int **pp_Var20;
  int *piVar21;
  long *plVar22;
  size_t sVar23;
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined8 uVar26;
  int num_input;
  int iVar27;
  ulong uVar28;
  long lVar29;
  void *pvVar30;
  ulong uVar31;
  void *pvVar32;
  int j;
  ulong uVar33;
  ulong uVar34;
  byte bVar35;
  undefined4 uVar36;
  long lVar37;
  int i_1;
  ulong uVar38;
  undefined2 *puVar39;
  int k;
  int iVar40;
  int iVar41;
  long lVar42;
  uint *puVar43;
  int i_4;
  long lVar44;
  void *pvVar45;
  int k_2;
  Mat *pMVar46;
  Mat *pMVar47;
  undefined2 *puVar48;
  undefined2 *puVar49;
  int p;
  long lVar50;
  undefined2 *puVar51;
  bool bVar52;
  byte bVar53;
  float fVar54;
  undefined8 local_d0;
  undefined1 local_c8 [64];
  size_t local_88;
  Mat *local_80;
  Mat *local_78;
  undefined4 local_6c;
  short sStack_68;
  uint auStack_66 [11];
  ulong local_38;
  
  p_Var17 = this->_vptr_Convolution_x86_fma[-3];
  iVar27 = *(int *)(p_Var17 + 0x2c + (long)&(this->weight_winograd23_data).data);
  iVar40 = *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
  uVar31 = (long)*(int *)(p_Var17 + 0x14 + (long)&(this->weight_winograd43_data).data) /
           (long)(iVar40 * iVar27);
  uVar15 = *(uint *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
  uVar31 = (long)((ulong)(uint)((int)uVar31 >> 0x1f) << 0x20 | uVar31 & 0xffffffff) /
           (long)(int)uVar15;
  uVar28 = uVar31 & 0xffffffff;
  bVar35 = opt->use_packing_layout;
  num_input = (int)uVar31;
  local_d0 = (void *)(long)num_input;
  if ((bool)bVar35 != true) {
    bVar52 = false;
    goto LAB_001f7977;
  }
  bVar52 = (uVar31 & 7) == 0;
  bVar53 = (uVar15 & 3) != 0;
  if ((uVar31 & 7) == 0 && (uVar15 & 3) == 0) {
    if (((iVar40 == 1 && iVar27 == 1) &&
        (*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1)) &&
       (((*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
         ((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
          (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) ||
        ((*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
         ((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 2 &&
          (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 2)))))))) {
      iVar27 = 1;
      iVar40 = iVar27;
LAB_001f8056:
      convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,uVar15,iVar27,iVar40);
    }
    else if ((((opt->use_winograd_convolution == true) &&
              (((iVar40 == 3 && (iVar27 == 3)) && (opt->use_winograd43_convolution != false)))) &&
             (((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)))) &&
            (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) {
      pMVar46 = (Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data);
      pMVar47 = &this->weight_winograd43_data;
      iVar27 = cpu_support_x86_avx2();
      if (iVar27 == 0) {
        iVar27 = cpu_support_x86_xop();
        if (iVar27 == 0) {
          local_88 = 0;
          local_c8._0_8_ = (void *)0x0;
          local_c8._8_4_ = 0;
          local_c8._12_4_ = 0;
          local_c8._16_8_ = 0;
          local_c8._24_4_ = 0;
          local_c8._32_8_ = (Allocator *)0x0;
          local_c8._40_4_ = 0;
          local_c8._44_4_ = 0;
          local_c8._48_12_ = SUB1612((undefined1  [16])0x0,4);
          uVar33 = 0;
          Mat::create((Mat *)local_c8,0x24,num_input,uVar15,2,(Allocator *)0x0);
          uVar38 = 0;
          if (0 < num_input) {
            uVar38 = uVar28;
          }
          local_38 = 0;
          if (0 < (int)uVar15) {
            local_38 = (ulong)uVar15;
          }
          local_6c = num_input * 9;
          local_78 = pMVar46;
          local_80 = pMVar47;
          for (; uVar33 != local_38; uVar33 = uVar33 + 1) {
            iVar27 = num_input * 9 * (int)uVar33;
            pvVar30 = pMVar46->data;
            pvVar45 = (void *)(local_c8._16_8_ * local_88 * uVar33 + local_c8._0_8_);
            for (uVar34 = 0; uVar34 != uVar38; uVar34 = uVar34 + 1) {
              lVar50 = uVar34 * 9;
              cVar3 = *(char *)((long)pvVar30 + lVar50 + iVar27);
              cVar4 = *(char *)((long)pvVar30 + lVar50 + (long)iVar27 + 1);
              cVar5 = *(char *)((long)pvVar30 + lVar50 + (long)iVar27 + 2);
              cVar6 = *(char *)((long)pvVar30 + lVar50 + (long)iVar27 + 3);
              cVar7 = *(char *)((long)pvVar30 + lVar50 + (long)iVar27 + 4);
              cVar8 = *(char *)((long)pvVar30 + lVar50 + (long)iVar27 + 5);
              cVar9 = *(char *)((long)pvVar30 + lVar50 + (long)iVar27 + 6);
              cVar10 = *(char *)((long)pvVar30 + lVar50 + (long)iVar27 + 7);
              cVar11 = *(char *)((long)pvVar30 + lVar50 + (long)iVar27 + 8);
              for (lVar50 = 4; lVar50 != 0x28; lVar50 = lVar50 + 6) {
                sVar12 = *(short *)(&UNK_005064ec + lVar50);
                sVar13 = *(short *)(&UNK_005064ee + lVar50);
                sVar14 = *(short *)((long)&DAT_005064f0 + lVar50);
                *(short *)((long)&local_6c + lVar50) =
                     sVar14 * cVar5 + sVar13 * cVar4 + sVar12 * cVar3;
                *(short *)((long)&local_6c + lVar50 + 2) =
                     sVar14 * cVar8 + sVar13 * cVar7 + sVar12 * cVar6;
                *(short *)((long)auStack_66 + lVar50 + -2) =
                     sVar14 * cVar11 + sVar13 * cVar10 + sVar12 * cVar9;
              }
              pvVar32 = pvVar45;
              for (lVar50 = 0; lVar50 != 6; lVar50 = lVar50 + 1) {
                sVar12 = *(short *)((long)auStack_66 + lVar50 * 6 + -2);
                uVar16 = *(uint *)((long)auStack_66 + lVar50 * 6);
                puVar43 = &DAT_005064f2;
                for (lVar29 = 0; lVar29 != 6; lVar29 = lVar29 + 1) {
                  auVar24 = vpmullw_avx(ZEXT416(*puVar43),ZEXT416(uVar16));
                  uVar36 = vpextrw_avx(auVar24,1);
                  *(short *)((long)pvVar32 + lVar29 * 2) =
                       (short)uVar36 + auVar24._0_2_ + *(short *)((long)puVar43 + -2) * sVar12;
                  puVar43 = (uint *)((long)puVar43 + 6);
                }
                pvVar32 = (void *)((long)pvVar32 + 0xc);
              }
              pvVar45 = (void *)((long)pvVar45 + (long)(int)local_c8._44_4_ * local_c8._16_8_);
              pMVar46 = local_78;
              pMVar47 = local_80;
            }
          }
          Mat::create(pMVar47,(int)((long)((ulong)(uint)(num_input >> 0x1f) << 0x20 | uVar28) / 8),
                      0x24,(int)uVar15 / 4,0x40,0x20,(Allocator *)0x0);
          iVar27 = (this->weight_winograd43_data).w;
          pvVar30 = (this->weight_winograd43_data).data;
          sVar18 = (this->weight_winograd43_data).elemsize;
          sVar23 = (this->weight_winograd43_data).cstep;
          for (uVar38 = 0; (long)(uVar38 | 3) < (long)(int)uVar15; uVar38 = uVar38 + 4) {
            lVar50 = 0;
            for (lVar29 = 0; lVar29 != 0x24; lVar29 = lVar29 + 1) {
              lVar42 = (long)pvVar30 +
                       (long)iVar27 * sVar18 * lVar29 + (uVar38 >> 2) * sVar23 * sVar18;
              puVar51 = (undefined2 *)
                        (local_88 * local_c8._16_8_ * uVar38 + lVar50 + local_c8._0_8_);
              for (uVar33 = 0; (long)(uVar33 | 7) < (long)local_d0; uVar33 = uVar33 + 8) {
                puVar39 = puVar51;
                for (lVar44 = 0; lVar44 != 4; lVar44 = lVar44 + 1) {
                  puVar48 = puVar39;
                  for (lVar37 = 0; lVar37 != 0x10; lVar37 = lVar37 + 2) {
                    *(undefined2 *)(lVar42 + lVar37) = *puVar48;
                    puVar48 = (undefined2 *)
                              ((long)puVar48 + (long)(int)local_c8._44_4_ * local_c8._16_8_);
                  }
                  puVar39 = (undefined2 *)((long)puVar39 + local_88 * local_c8._16_8_);
                  lVar42 = lVar42 + 0x10;
                }
                puVar51 = puVar51 + (long)(int)local_c8._44_4_ * local_c8._16_8_ * 4;
              }
              lVar50 = lVar50 + 2;
            }
          }
          piVar21 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
          if (piVar21 != (int *)0x0) {
            LOCK();
            *piVar21 = *piVar21 + -1;
            UNLOCK();
            if (*piVar21 == 0) {
              if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
                free((void *)local_c8._0_8_);
              }
              else {
                (*(*(_func_int ***)local_c8._32_8_)[3])();
              }
            }
          }
          goto LAB_001f78b0;
        }
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop
                  (pMVar46,pMVar47,num_input,uVar15,opt);
      }
      else {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2
                  (pMVar46,pMVar47,num_input,uVar15,opt);
      }
    }
    else {
      if (opt->use_sgemm_convolution == true) goto LAB_001f8056;
      convolution_transform_kernel_packed_int8_sse
                ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_data_tm,num_input,uVar15,iVar27,iVar40,8,4);
    }
LAB_001f7977:
    bVar53 = bVar35 ^ 1;
  }
  else {
LAB_001f78b0:
    bVar35 = bVar52;
    if (((uVar15 & 3) == 0) && ((uVar31 & 7) != 0)) {
      p_Var17 = this->_vptr_Convolution_x86_fma[-3];
      iVar27 = *(int *)(p_Var17 + 0x2c + (long)&(this->weight_winograd23_data).data);
      if (iVar27 == 7) {
        if ((((*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) != 7) ||
             (*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1)) ||
            (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
           ((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) != 2 ||
            (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) != 2))))
        goto LAB_001f8137;
        iVar40 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
        iVar27 = 7;
        iVar41 = iVar27;
      }
      else if (iVar27 == 3) {
        if ((*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) != 3) ||
           ((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1 ||
              (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1 ||
              (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)))) &&
            ((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1 ||
               (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
              (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) != 2)) ||
             (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) != 2))))))
        goto LAB_001f8137;
        iVar40 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
        iVar27 = 3;
        iVar41 = iVar27;
      }
      else if (((iVar27 == 1) &&
               (*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              ((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
                 ((*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
                  (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)))) &&
                (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) ||
               ((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
                  (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
                 (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 2)) &&
                (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 2)))))) {
        iVar40 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
        iVar27 = 1;
        iVar41 = iVar27;
      }
      else {
LAB_001f8137:
        iVar40 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
        iVar41 = *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
        if (opt->use_sgemm_convolution != true) {
          convolution_transform_kernel_packed_int8_sse
                    ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
                     &this->weight_data_tm,num_input,iVar40,iVar27,iVar41,1,4);
          goto LAB_001f81f2;
        }
      }
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,iVar40,iVar27,iVar41);
      goto LAB_001f81f2;
    }
  }
  if ((bVar53 != 0) && (bVar52)) {
    p_Var17 = this->_vptr_Convolution_x86_fma[-3];
    iVar27 = *(int *)(p_Var17 + 0x2c + (long)&(this->weight_winograd23_data).data);
    if (((iVar27 == 1) &&
        (*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) == 1)) &&
       (((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
         (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) ||
        ((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 2)) &&
         (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 2)))))) {
      convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,
                 *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data),1,1);
    }
    else if ((((opt->use_winograd_convolution == true) && (iVar27 == 3)) &&
             ((opt->use_winograd43_convolution != false &&
              ((*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) == 3 &&
               (*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1)))))) &&
            ((*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
             ((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
              (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))))) {
      pMVar47 = &this->weight_winograd43_data;
      uVar15 = *(uint *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
      pMVar46 = (Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data);
      iVar27 = cpu_support_x86_avx2();
      if (iVar27 == 0) {
        iVar27 = cpu_support_x86_xop();
        if (iVar27 == 0) {
          local_88 = 0;
          local_c8._0_8_ = (void *)0x0;
          local_c8._8_4_ = 0;
          local_c8._12_4_ = 0;
          local_c8._16_8_ = 0;
          local_c8._24_4_ = 0;
          local_c8._32_8_ = (Allocator *)0x0;
          local_c8._40_4_ = 0;
          local_c8._44_4_ = 0;
          local_c8._48_12_ = SUB1612((undefined1  [16])0x0,4);
          uVar38 = 0;
          Mat::create((Mat *)local_c8,0x24,num_input,uVar15,2,(Allocator *)0x0);
          uVar31 = 0;
          if (0 < num_input) {
            uVar31 = uVar28;
          }
          uVar33 = 0;
          if (0 < (int)uVar15) {
            uVar33 = (ulong)uVar15;
          }
          local_78 = pMVar46;
          local_80 = pMVar47;
          for (; uVar38 != uVar33; uVar38 = uVar38 + 1) {
            iVar27 = num_input * 9 * (int)uVar38;
            pvVar30 = pMVar46->data;
            pvVar45 = (void *)(local_c8._16_8_ * local_88 * uVar38 + local_c8._0_8_);
            for (uVar34 = 0; uVar34 != uVar31; uVar34 = uVar34 + 1) {
              lVar50 = uVar34 * 9;
              cVar3 = *(char *)((long)pvVar30 + lVar50 + iVar27);
              cVar4 = *(char *)((long)pvVar30 + lVar50 + (long)iVar27 + 1);
              cVar5 = *(char *)((long)pvVar30 + lVar50 + (long)iVar27 + 2);
              cVar6 = *(char *)((long)pvVar30 + lVar50 + (long)iVar27 + 3);
              cVar7 = *(char *)((long)pvVar30 + lVar50 + (long)iVar27 + 4);
              cVar8 = *(char *)((long)pvVar30 + lVar50 + (long)iVar27 + 5);
              cVar9 = *(char *)((long)pvVar30 + lVar50 + (long)iVar27 + 6);
              cVar10 = *(char *)((long)pvVar30 + lVar50 + (long)iVar27 + 7);
              cVar11 = *(char *)((long)pvVar30 + lVar50 + (long)iVar27 + 8);
              for (lVar50 = 4; lVar50 != 0x28; lVar50 = lVar50 + 6) {
                sVar12 = *(short *)(&UNK_005064ec + lVar50);
                sVar13 = *(short *)(&UNK_005064ee + lVar50);
                sVar14 = *(short *)((long)&DAT_005064f0 + lVar50);
                *(short *)((long)&local_6c + lVar50) =
                     sVar14 * cVar5 + sVar13 * cVar4 + sVar12 * cVar3;
                *(short *)((long)&local_6c + lVar50 + 2) =
                     sVar14 * cVar8 + sVar13 * cVar7 + sVar12 * cVar6;
                *(short *)((long)auStack_66 + lVar50 + -2) =
                     sVar14 * cVar11 + sVar13 * cVar10 + sVar12 * cVar9;
              }
              pvVar32 = pvVar45;
              for (lVar50 = 0; lVar50 != 6; lVar50 = lVar50 + 1) {
                sVar12 = *(short *)((long)auStack_66 + lVar50 * 6 + -2);
                uVar16 = *(uint *)((long)auStack_66 + lVar50 * 6);
                puVar43 = &DAT_005064f2;
                for (lVar29 = 0; lVar29 != 6; lVar29 = lVar29 + 1) {
                  auVar24 = vpmullw_avx(ZEXT416(*puVar43),ZEXT416(uVar16));
                  uVar36 = vpextrw_avx(auVar24,1);
                  *(short *)((long)pvVar32 + lVar29 * 2) =
                       (short)uVar36 + auVar24._0_2_ + *(short *)((long)puVar43 + -2) * sVar12;
                  puVar43 = (uint *)((long)puVar43 + 6);
                }
                pvVar32 = (void *)((long)pvVar32 + 0xc);
              }
              pvVar45 = (void *)((long)pvVar45 + (long)(int)local_c8._44_4_ * local_c8._16_8_);
              pMVar46 = local_78;
              pMVar47 = local_80;
            }
          }
          Mat::create(pMVar47,num_input,0x24,((int)uVar15 / 4) * -3 + uVar15,8,4,(Allocator *)0x0);
          iVar27 = (this->weight_winograd43_data).w;
          pvVar30 = (this->weight_winograd43_data).data;
          sVar18 = (this->weight_winograd43_data).elemsize;
          sVar23 = (this->weight_winograd43_data).cstep;
          for (uVar31 = 0; (long)(uVar31 | 3) < (long)(int)uVar15; uVar31 = uVar31 + 4) {
            lVar50 = 0;
            for (lVar29 = 0; lVar29 != 0x24; lVar29 = lVar29 + 1) {
              lVar42 = (long)pvVar30 +
                       (long)iVar27 * sVar18 * lVar29 + (uVar31 >> 2) * sVar23 * sVar18;
              puVar51 = (undefined2 *)
                        (local_88 * local_c8._16_8_ * uVar31 + lVar50 + local_c8._0_8_);
              for (uVar38 = 0; (long)(uVar38 | 7) < (long)local_d0; uVar38 = uVar38 + 8) {
                puVar39 = puVar51;
                for (lVar44 = 0; lVar44 != 4; lVar44 = lVar44 + 1) {
                  puVar48 = puVar39;
                  for (lVar37 = 0; lVar37 != 0x10; lVar37 = lVar37 + 2) {
                    *(undefined2 *)(lVar42 + lVar37) = *puVar48;
                    puVar48 = (undefined2 *)
                              ((long)puVar48 + (long)(int)local_c8._44_4_ * local_c8._16_8_);
                  }
                  puVar39 = (undefined2 *)((long)puVar39 + local_88 * local_c8._16_8_);
                  lVar42 = lVar42 + 0x10;
                }
                puVar51 = puVar51 + (long)(int)local_c8._44_4_ * local_c8._16_8_ * 4;
              }
              lVar50 = lVar50 + 2;
            }
          }
          iVar27 = (this->weight_winograd43_data).w;
          pvVar30 = (this->weight_winograd43_data).data;
          sVar18 = (this->weight_winograd43_data).elemsize;
          sVar23 = (this->weight_winograd43_data).cstep;
          puVar51 = (undefined2 *)(local_c8._16_8_ * local_88 * uVar31 + local_c8._0_8_);
          for (; (long)uVar31 < (long)(int)uVar15; uVar31 = uVar31 + 1) {
            puVar39 = puVar51;
            for (lVar50 = 0; lVar50 != 0x24; lVar50 = lVar50 + 1) {
              lVar29 = (long)pvVar30 +
                       (long)iVar27 * sVar18 * lVar50 +
                       (ulong)(((uint)uVar31 & 3) + ((uint)(uVar31 >> 2) & 0x3fffffff)) *
                       sVar23 * sVar18;
              puVar48 = puVar39;
              for (uVar38 = 0; (long)(uVar38 | 7) < (long)local_d0; uVar38 = uVar38 + 8) {
                puVar49 = puVar48;
                for (lVar42 = 0; lVar42 != 0x10; lVar42 = lVar42 + 2) {
                  *(undefined2 *)(lVar29 + lVar42) = *puVar49;
                  puVar49 = (undefined2 *)
                            ((long)puVar49 + (long)(int)local_c8._44_4_ * local_c8._16_8_);
                }
                puVar48 = puVar48 + (long)(int)local_c8._44_4_ * local_c8._16_8_ * 4;
                lVar29 = lVar29 + 0x10;
              }
              puVar39 = puVar39 + 1;
            }
            puVar51 = (undefined2 *)((long)puVar51 + local_c8._16_8_ * local_88);
          }
          piVar21 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
          if (piVar21 != (int *)0x0) {
            LOCK();
            *piVar21 = *piVar21 + -1;
            UNLOCK();
            if (*piVar21 == 0) {
              if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
                free((void *)local_c8._0_8_);
              }
              else {
                (*(*(_func_int ***)local_c8._32_8_)[3])();
              }
            }
          }
        }
        else {
          conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_xop
                    (pMVar46,pMVar47,num_input,uVar15,opt);
        }
      }
      else {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2
                  (pMVar46,pMVar47,num_input,uVar15,opt);
      }
    }
    else if (opt->use_sgemm_convolution == true) {
      convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,
                 *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data),iVar27,
                 *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data));
    }
    else {
      convolution_transform_kernel_packed_int8_sse
                ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_data_tm,num_input,
                 *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data),iVar27,
                 *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data),8,1);
    }
  }
  if ((bVar53 & (bVar35 ^ 1)) == 1) {
    p_Var17 = this->_vptr_Convolution_x86_fma[-3];
    iVar27 = *(int *)(p_Var17 + 0x2c + (long)&(this->weight_winograd23_data).data);
    if (((iVar27 == 1) &&
        (*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) == 1)) &&
       (((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
         (((*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) ||
        ((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 2)) &&
         (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 2)))))) {
      iVar41 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
      iVar40 = 1;
      iVar27 = iVar40;
    }
    else {
      if ((((opt->use_winograd_convolution == true) && (iVar27 == 3)) &&
          (((opt->use_winograd23_convolution != false &&
            (((*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) == 3 &&
              (*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1)) &&
             (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
           ((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))))) &&
         (0xf < num_input)) {
        iVar40 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
        if (0xf < (long)iVar40) {
          Mat::create(&this->weight_winograd23_data,0x10,num_input,iVar40,2,(Allocator *)0x0);
          for (lVar50 = 0; lVar50 != iVar40; lVar50 = lVar50 + 1) {
            lVar29 = (long)(num_input * 9 * (int)lVar50) +
                     *(long *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data);
            iVar27 = (this->weight_winograd23_data).w;
            sVar18 = (this->weight_winograd23_data).elemsize;
            pvVar30 = (void *)(sVar18 * (this->weight_winograd23_data).cstep * lVar50 +
                              (long)(this->weight_winograd23_data).data);
            for (uVar31 = 0; pvVar45 = pvVar30, uVar31 != uVar28; uVar31 = uVar31 + 1) {
              lVar42 = uVar31 * 9;
              cVar3 = *(char *)(lVar29 + lVar42);
              cVar4 = *(char *)(lVar29 + 1 + lVar42);
              cVar5 = *(char *)(lVar29 + 2 + lVar42);
              cVar6 = *(char *)(lVar29 + 3 + lVar42);
              cVar7 = *(char *)(lVar29 + 4 + lVar42);
              cVar8 = *(char *)(lVar29 + 5 + lVar42);
              cVar9 = *(char *)(lVar29 + 6 + lVar42);
              cVar10 = *(char *)(lVar29 + 7 + lVar42);
              cVar11 = *(char *)(lVar29 + 8 + lVar42);
              for (lVar42 = 4; lVar42 != 0x1c; lVar42 = lVar42 + 6) {
                sVar12 = *(short *)(&UNK_0050651c + lVar42);
                sVar13 = *(short *)(&UNK_0050651e + lVar42);
                sVar14 = *(short *)((long)&DAT_00506520 + lVar42);
                *(short *)((long)&local_d0 + lVar42 + 4) =
                     sVar14 * cVar5 + sVar13 * cVar4 + sVar12 * cVar3;
                *(short *)((long)&local_d0 + lVar42 + 6) =
                     sVar14 * cVar8 + sVar13 * cVar7 + sVar12 * cVar6;
                *(short *)(local_c8 + lVar42) = sVar14 * cVar11 + sVar13 * cVar10 + sVar12 * cVar9;
              }
              pvVar30 = pvVar45;
              for (lVar42 = 0; lVar42 != 4; lVar42 = lVar42 + 1) {
                sVar12 = *(short *)(local_c8 + lVar42 * 6);
                uVar15 = *(uint *)(local_c8 + lVar42 * 6 + 2);
                puVar43 = &DAT_00506522;
                for (lVar44 = 0; lVar44 != 4; lVar44 = lVar44 + 1) {
                  auVar24 = vpmullw_avx(ZEXT416(*puVar43),ZEXT416(uVar15));
                  uVar36 = vpextrw_avx(auVar24,1);
                  *(short *)((long)pvVar30 + lVar44 * 2) =
                       (short)uVar36 + auVar24._0_2_ + *(short *)((long)puVar43 + -2) * sVar12;
                  puVar43 = (uint *)((long)puVar43 + 6);
                }
                pvVar30 = (void *)((long)pvVar30 + 8);
              }
              pvVar30 = (void *)((long)pvVar45 + (long)iVar27 * sVar18);
              local_d0 = pvVar45;
            }
          }
          goto LAB_001f81f2;
        }
      }
      if (opt->use_sgemm_convolution != true) {
        if (p_Var17 != (_func_int *)0xfffffffffffffeb8) {
          piVar21 = *(int **)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data);
          if (piVar21 != (int *)0x0) {
            LOCK();
            *piVar21 = *piVar21 + 1;
            UNLOCK();
          }
          piVar21 = (this->weight_data_tm).refcount;
          if (piVar21 != (int *)0x0) {
            LOCK();
            *piVar21 = *piVar21 + -1;
            UNLOCK();
            if (*piVar21 == 0) {
              pAVar19 = (this->weight_data_tm).allocator;
              if (pAVar19 == (Allocator *)0x0) {
                free((this->weight_data_tm).data);
              }
              else {
                (*pAVar19->_vptr_Allocator[3])();
              }
            }
          }
          (this->weight_data_tm).cstep = 0;
          *(undefined1 (*) [16])((long)&(this->weight_data_tm).refcount + 4) = (undefined1  [16])0x0
          ;
          (this->weight_data_tm).data = (void *)0x0;
          (this->weight_data_tm).refcount = (int *)0x0;
          (this->weight_data_tm).c = 0;
          (this->weight_data_tm).dims = 0;
          (this->weight_data_tm).w = 0;
          (this->weight_data_tm).h = 0;
          (this->weight_data_tm).d = 0;
          piVar21 = *(int **)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data + 8);
          (this->weight_data_tm).data =
               *(void **)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data);
          (this->weight_data_tm).refcount = piVar21;
          (this->weight_data_tm).elemsize =
               *(size_t *)(p_Var17 + 0x38 + (long)&(this->weight_winograd63_data).data);
          (this->weight_data_tm).elempack =
               *(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd63_data).data);
          (this->weight_data_tm).allocator =
               *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var17);
          p_Var1 = (_func_int *)((long)&this->gemm + (long)p_Var17);
          uVar25 = *(undefined8 *)p_Var1;
          uVar26 = *(undefined8 *)(p_Var1 + 8);
          (this->weight_data_tm).dims = (int)uVar25;
          (this->weight_data_tm).w = (int)((ulong)uVar25 >> 0x20);
          (this->weight_data_tm).h = (int)uVar26;
          (this->weight_data_tm).d = (int)((ulong)uVar26 >> 0x20);
          (this->weight_data_tm).c = *(int *)(p_Var17 + 8 + (long)&(this->scale_in_data).data);
          (this->weight_data_tm).cstep =
               *(size_t *)(p_Var17 + 0x10 + (long)&(this->scale_in_data).data);
        }
        goto LAB_001f81f2;
      }
      iVar41 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
      iVar40 = *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
    }
    convolution_im2col_sgemm_transform_kernel_int8_sse
              ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
               &this->weight_sgemm_data,num_input,iVar41,iVar27,iVar40);
  }
LAB_001f81f2:
  Mat::create(&this->scale_in_data,
              *(int *)(this->_vptr_Convolution_x86_fma[-3] + 0x28 +
                      (long)&(this->weight_winograd23_data).data),4,(Allocator *)0x0);
  pp_Var20 = this->_vptr_Convolution_x86_fma;
  pvVar30 = (this->scale_in_data).data;
  for (lVar50 = 0; p_Var17 = pp_Var20[-3],
      lVar50 < *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
      lVar50 = lVar50 + 1) {
    fVar2 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var17) + lVar50 * 4);
    fVar54 = 0.0;
    if (fVar2 != 0.0) {
      fVar54 = 1.0 / (fVar2 * **(float **)(&this->field_0x238 + (long)p_Var17));
    }
    *(float *)((long)pvVar30 + lVar50 * 4) = fVar54;
  }
  if (opt->lightmode != false) {
    piVar21 = *(int **)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data);
    if (piVar21 != (int *)0x0) {
      LOCK();
      *piVar21 = *piVar21 + -1;
      UNLOCK();
      if (*piVar21 == 0) {
        plVar22 = *(long **)((long)&this->convolution_dilation1 + (long)p_Var17);
        if (plVar22 == (long *)0x0) {
          free(*(void **)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data));
        }
        else {
          (**(code **)(*plVar22 + 0x18))();
        }
      }
    }
    *(undefined8 *)(p_Var17 + 0x10 + (long)&(this->scale_in_data).data) = 0;
    *(undefined8 *)(p_Var17 + 0x34 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var17 + 0x3c + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)((long)&this->gemm + (long)p_Var17) = 0;
    *(undefined8 *)(p_Var17 + (long)&(this->scale_in_data).data) = 0;
    *(undefined4 *)(p_Var17 + 8 + (long)&(this->scale_in_data).data) = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_fma::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        elempack = num_input % 8 == 0 ? 8 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            // conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}